

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::PointerBuilder::getListAnySize
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  ushort uVar3;
  StructDataBitCount SVar4;
  CapTableBuilder *capTable;
  word *pwVar5;
  uint64_t uVar6;
  WirePointer *pWVar7;
  SegmentBuilder *this_00;
  ElementSize EVar8;
  uint uVar9;
  ulong uVar10;
  WirePointer *pWVar11;
  Fault f;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  SegmentBuilder *local_38;
  WirePointer *local_30;
  
  local_30 = this->pointer;
  local_38 = this->segment;
  capTable = this->capTable;
  uVar9 = (local_30->offsetAndKind).value;
  if ((local_30->field_1).upper32Bits == 0 && uVar9 == 0) goto LAB_0011912a;
  pWVar7 = local_30 + (long)((int)uVar9 >> 2) + 1;
  while( true ) {
    pWVar11 = local_30;
    this_00 = local_38;
    if ((uVar9 & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(local_38->super_SegmentReader).arena,
                           (SegmentId)(local_30->field_1).structRef);
      uVar9 = (pWVar11->offsetAndKind).value;
      pwVar5 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar9 & 0xfffffff8);
      pWVar1 = (WirePointer *)((long)&pwVar5->content + uVar10);
      pWVar11 = (WirePointer *)((long)&pwVar5[1].content + uVar10);
      if ((uVar9 & 4) == 0) {
        pWVar7 = pWVar11 + ((int)(pWVar1->offsetAndKind).value >> 2);
        pWVar11 = pWVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar1->field_1).structRef);
        pWVar7 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar1->offsetAndKind).value & 0xfffffff8));
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (pWVar11->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.result) break;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[92]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x582,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a \" \"list.\""
               ,&_kjCondition,
               (char (*) [92])
               "Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a list."
              );
    kj::_::Debug::Fault::~Fault(&f);
LAB_0011912a:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
      return __return_storage_ptr__;
    }
    pWVar7 = (WirePointer *)
             WireHelpers::copyMessage(&local_38,capTable,&local_30,(WirePointer *)defaultValue);
    uVar9 = (local_30->offsetAndKind).value;
    defaultValue = (word *)0x0;
  }
  uVar9 = (pWVar11->field_1).upper32Bits;
  EVar8 = (ElementSize)uVar9 & INLINE_COMPOSITE;
  if (EVar8 != INLINE_COMPOSITE) {
    SVar4 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar8 * 4);
    __return_storage_ptr__->segment = this_00;
    __return_storage_ptr__->capTable = capTable;
    __return_storage_ptr__->ptr = (byte *)pWVar7;
    __return_storage_ptr__->elementCount = uVar9 >> 3;
    __return_storage_ptr__->step = (uint)(EVar8 == POINTER) * 0x40 + SVar4;
    __return_storage_ptr__->structDataSize = SVar4;
    __return_storage_ptr__->structPointerCount = (ushort)(EVar8 == POINTER);
    __return_storage_ptr__->elementSize = EVar8;
    return __return_storage_ptr__;
  }
  _kjCondition.right = STRUCT;
  _kjCondition.left = (Kind)*(uint64_t *)&(pWVar7->offsetAndKind).value & OTHER;
  _kjCondition.result = _kjCondition.left == STRUCT;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    uVar2 = *(ushort *)&pWVar7->field_1;
    uVar3 = (pWVar7->field_1).structRef.ptrCount.value;
    uVar6 = *(uint64_t *)&(pWVar7->offsetAndKind).value;
    __return_storage_ptr__->segment = this_00;
    __return_storage_ptr__->capTable = capTable;
    __return_storage_ptr__->ptr = (byte *)(pWVar7 + 1);
    __return_storage_ptr__->elementCount = (uint)uVar6 >> 2 & 0x1fffffff;
    __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
    __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
    __return_storage_ptr__->structPointerCount = uVar3;
    __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0x58c,FAILED,"tag->kind() == WirePointer::STRUCT",
             "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
             &_kjCondition,
             (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

ListBuilder PointerBuilder::getListAnySize(const word* defaultValue) {
  return WireHelpers::getWritableListPointerAnySize(pointer, segment, capTable, defaultValue);
}